

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.h
# Opt level: O3

void __thiscall Http_Handle::Http_Handle(Http_Handle *this)

{
  (this->Req)._M_dataplus._M_p = (pointer)&(this->Req).field_2;
  (this->Req)._M_string_length = 0;
  (this->Req).field_2._M_local_buf[0] = '\0';
  (this->_version)._M_dataplus._M_p = (pointer)&(this->_version).field_2;
  (this->_version)._M_string_length = 0;
  (this->_version).field_2._M_local_buf[0] = '\0';
  (this->URI)._M_dataplus._M_p = (pointer)&(this->URI).field_2;
  (this->URI)._M_string_length = 0;
  (this->URI).field_2._M_local_buf[0] = '\0';
  (this->request_head)._M_h._M_buckets = &(this->request_head)._M_h._M_single_bucket;
  (this->request_head)._M_h._M_bucket_count = 1;
  (this->request_head)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->request_head)._M_h._M_element_count = 0;
  (this->request_head)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->request_head)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->request_head)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->request_body)._M_dataplus._M_p = (pointer)&(this->request_body).field_2;
  (this->request_body)._M_string_length = 0;
  (this->request_body).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x111c70);
  std::__cxx11::string::_M_replace
            ((ulong)&this->_version,0,(char *)(this->_version)._M_string_length,0x111c70);
  std::__cxx11::string::_M_replace
            ((ulong)&this->URI,0,(char *)(this->URI)._M_string_length,0x111c70);
  return;
}

Assistant:

Http_Handle()
    {
        Req = "";
        _version = "";
        URI = "";
    }